

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O1

int mbedtls_sha256_ret(uchar *input,size_t ilen,uchar *output,int is224)

{
  long lVar1;
  bool bVar2;
  mbedtls_sha256_context local_98;
  
  bVar2 = is224 == 0;
  local_98.total[0] = 0;
  local_98.total[1] = 0;
  local_98.buffer[0] = '\0';
  local_98.buffer[1] = '\0';
  local_98.buffer[2] = '\0';
  local_98.buffer[3] = '\0';
  local_98.buffer[4] = '\0';
  local_98.buffer[5] = '\0';
  local_98.buffer[6] = '\0';
  local_98.buffer[7] = '\0';
  local_98.buffer[0x38] = '\0';
  local_98.buffer[0x39] = '\0';
  local_98.buffer[0x3a] = '\0';
  local_98.buffer[0x3b] = '\0';
  local_98.buffer[0x28] = '\0';
  local_98.buffer[0x29] = '\0';
  local_98.buffer[0x2a] = '\0';
  local_98.buffer[0x2b] = '\0';
  local_98.buffer[0x2c] = '\0';
  local_98.buffer[0x2d] = '\0';
  local_98.buffer[0x2e] = '\0';
  local_98.buffer[0x2f] = '\0';
  local_98.buffer[0x30] = '\0';
  local_98.buffer[0x31] = '\0';
  local_98.buffer[0x32] = '\0';
  local_98.buffer[0x33] = '\0';
  local_98.buffer[0x34] = '\0';
  local_98.buffer[0x35] = '\0';
  local_98.buffer[0x36] = '\0';
  local_98.buffer[0x37] = '\0';
  local_98.buffer[0x18] = '\0';
  local_98.buffer[0x19] = '\0';
  local_98.buffer[0x1a] = '\0';
  local_98.buffer[0x1b] = '\0';
  local_98.buffer[0x1c] = '\0';
  local_98.buffer[0x1d] = '\0';
  local_98.buffer[0x1e] = '\0';
  local_98.buffer[0x1f] = '\0';
  local_98.buffer[0x20] = '\0';
  local_98.buffer[0x21] = '\0';
  local_98.buffer[0x22] = '\0';
  local_98.buffer[0x23] = '\0';
  local_98.buffer[0x24] = '\0';
  local_98.buffer[0x25] = '\0';
  local_98.buffer[0x26] = '\0';
  local_98.buffer[0x27] = '\0';
  local_98.buffer[8] = '\0';
  local_98.buffer[9] = '\0';
  local_98.buffer[10] = '\0';
  local_98.buffer[0xb] = '\0';
  local_98.buffer[0xc] = '\0';
  local_98.buffer[0xd] = '\0';
  local_98.buffer[0xe] = '\0';
  local_98.buffer[0xf] = '\0';
  local_98.buffer[0x10] = '\0';
  local_98.buffer[0x11] = '\0';
  local_98.buffer[0x12] = '\0';
  local_98.buffer[0x13] = '\0';
  local_98.buffer[0x14] = '\0';
  local_98.buffer[0x15] = '\0';
  local_98.buffer[0x16] = '\0';
  local_98.buffer[0x17] = '\0';
  local_98.state[0] = 0xc1059ed8;
  if (bVar2) {
    local_98.state[0] = 0x6a09e667;
  }
  local_98.state[1] = 0x367cd507;
  if (bVar2) {
    local_98.state[1] = 0xbb67ae85;
  }
  local_98.state[2] = 0x3070dd17;
  if (bVar2) {
    local_98.state[2] = 0x3c6ef372;
  }
  local_98.state[3] = 0xf70e5939;
  if (bVar2) {
    local_98.state[3] = 0xa54ff53a;
  }
  local_98.state[4] = 0xffc00b31;
  if (bVar2) {
    local_98.state[4] = 0x510e527f;
  }
  local_98.state[5] = 0x68581511;
  if (bVar2) {
    local_98.state[5] = 0x9b05688c;
  }
  local_98.state[6] = 0x64f98fa7;
  if (bVar2) {
    local_98.state[6] = 0x1f83d9ab;
  }
  local_98.state[7] = 0xbefa4fa4;
  if (bVar2) {
    local_98.state[7] = 0x5be0cd19;
  }
  local_98._100_8_ = (ulong)(uint)is224 << 0x20;
  mbedtls_sha256_update_ret(&local_98,input,ilen);
  mbedtls_sha256_finish_ret(&local_98,output);
  lVar1 = 0;
  do {
    *(undefined1 *)((long)local_98.total + lVar1) = 0;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x6c);
  return 0;
}

Assistant:

int mbedtls_sha256_ret( const unsigned char *input,
                        size_t ilen,
                        unsigned char output[32],
                        int is224 )
{
    int ret;
    mbedtls_sha256_context ctx;

    mbedtls_sha256_init( &ctx );

    if( ( ret = mbedtls_sha256_starts_ret( &ctx, is224 ) ) != 0 )
        goto exit;

    if( ( ret = mbedtls_sha256_update_ret( &ctx, input, ilen ) ) != 0 )
        goto exit;

    if( ( ret = mbedtls_sha256_finish_ret( &ctx, output ) ) != 0 )
        goto exit;

exit:
    mbedtls_sha256_free( &ctx );

    return( ret );
}